

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::stringifyBinaryExpr<bool,bool>
          (String *__return_storage_ptr__,detail *this,bool *lhs,char *op,bool *rhs)

{
  char *in;
  char *in_00;
  String SStack_88;
  String local_70;
  String local_58;
  String local_40;
  
  in_00 = "false";
  in = "false";
  if (*this != (detail)0x0) {
    in = "true";
  }
  String::String(&local_58,in);
  String::String(&local_70,lhs);
  operator+(&local_40,&local_58,&local_70);
  if (*op != '\0') {
    in_00 = "true";
  }
  String::String(&SStack_88,in_00);
  operator+(__return_storage_ptr__,&local_40,&SStack_88);
  String::~String(&SStack_88);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }